

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O2

void __thiscall
PDFDocumentHandler::RegisterResourcesForResourcesCategory
          (PDFDocumentHandler *this,PDFFormXObject *inTargetFormXObject,
          ICategoryServicesCommand *inCommand,PDFDictionary *inResourcesDictionary,
          ObjectIDTypeList *ioObjectsToLaterCopy,StringToStringMap *ioMappedResourcesNames)

{
  PDFParser *this_00;
  DocumentContext *this_01;
  bool bVar1;
  EPDFObjectType EVar2;
  PDFObject *inOriginal;
  iterator iVar3;
  ResourceCopierTask *this_02;
  IndirectObjectsReferenceRegistry *this_03;
  _Base_ptr p_Var4;
  string *psVar5;
  PDFDocumentHandler *pPVar6;
  PDFFormXObject *this_04;
  PDFDocumentHandler *this_05;
  PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  string local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_70;
  string local_50;
  
  this_00 = this->mParser;
  (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_b0,inCommand);
  inOriginal = PDFParser::QueryDictionaryObject(this_00,inResourcesDictionary,&local_b0.first);
  resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue =
       PDFObjectCast<PDFDictionary>(inOriginal);
  resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>._vptr_RefCountPtr =
       (_func_int **)&PTR__RefCountPtr_0036d8c0;
  std::__cxx11::string::~string((string *)&local_b0);
  if (resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue != (PDFDictionary *)0x0) {
    PDFDictionary::GetIterator
              (&it,resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>.mValue);
    while( true ) {
      bVar1 = ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              ::MoveNext(&it.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                        );
      if (!bVar1) break;
      EVar2 = PDFObject::GetType((PDFObject *)
                                 it.
                                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                 .mCurrentPosition._M_node[1]._M_parent);
      if (EVar2 == ePDFObjectIndirectObjectReference) {
        this_05 = (PDFDocumentHandler *)
                  &it.
                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   .mCurrentPosition._M_node[1]._M_parent[2]._M_parent;
        pPVar6 = this_05;
        iVar3 = std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                ::find(&(this->mSourceToTarget)._M_t,(key_type *)this_05);
        if ((_Rb_tree_header *)iVar3._M_node ==
            &(this->mSourceToTarget)._M_t._M_impl.super__Rb_tree_header) {
          this_03 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
          p_Var4 = (_Base_ptr)IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_03);
          local_b0.first._M_dataplus._M_p = *(pointer *)this_05;
          local_b0.first._M_string_length = (size_type)p_Var4;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::_M_insert_unique<std::pair<unsigned_long_const,unsigned_long>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)&this->mSourceToTarget,(pair<const_unsigned_long,_unsigned_long> *)&local_b0
                    );
          std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (ioObjectsToLaterCopy,(value_type_conflict *)this_05);
        }
        else {
          p_Var4 = iVar3._M_node[1]._M_parent;
          this_05 = pPVar6;
        }
        psVar5 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (it.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        AsEncodedName(&local_d0,this_05,psVar5);
        (*inCommand->_vptr_ICategoryServicesCommand[3])(&local_50,inCommand,p_Var4);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_b0,&local_d0,&local_50);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)ioMappedResourcesNames,&local_b0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      else {
        this_02 = (ResourceCopierTask *)operator_new(0x40);
        this_04 = inTargetFormXObject;
        ResourceCopierTask::ResourceCopierTask
                  (this_02,inTargetFormXObject,this,
                   (PDFObject *)
                   it.
                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                   .mCurrentPosition._M_node[1]._M_parent);
        psVar5 = PDFName::GetValue_abi_cxx11_
                           (*(PDFName **)
                             (it.
                              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                              .mCurrentPosition._M_node + 1));
        AsEncodedName(&local_d0,(PDFDocumentHandler *)this_04,psVar5);
        this_01 = this->mDocumentContext;
        (*inCommand->_vptr_ICategoryServicesCommand[2])(&local_70,inCommand);
        PDFHummus::DocumentContext::AddExtendedResourceMapping
                  (&local_50,this_01,inTargetFormXObject,&local_70,(IResourceWritingTask *)this_02);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_b0,&local_d0,&local_50);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)ioMappedResourcesNames,&local_b0);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::_M_assign((string *)&this_02->mResourceName);
      }
    }
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr
            (&resourcesCategoryDictionary.super_RefCountPtr<PDFDictionary>);
  return;
}

Assistant:

void PDFDocumentHandler::RegisterResourcesForResourcesCategory(PDFFormXObject* inTargetFormXObject,
                                                               ICategoryServicesCommand* inCommand,
                                                               PDFDictionary* inResourcesDictionary,
                                                               ObjectIDTypeList& ioObjectsToLaterCopy,
                                                               StringToStringMap& ioMappedResourcesNames)
{
    PDFObjectCastPtr<PDFDictionary> resourcesCategoryDictionary(mParser->QueryDictionaryObject(
                                                                                    inResourcesDictionary,inCommand->GetResourcesCategoryName()));
    if(resourcesCategoryDictionary.GetPtr())
    {	
        MapIterator<PDFNameToPDFObjectMap> it(resourcesCategoryDictionary->GetIterator());
        while(it.MoveNext())
        {
            if(it.GetValue()->GetType() == PDFObject::ePDFObjectIndirectObjectReference)
            {
                PDFIndirectObjectReference* indirectReference = (PDFIndirectObjectReference*)(it.GetValue());
                ObjectIDTypeToObjectIDTypeMap::iterator	itObjects = mSourceToTarget.find(indirectReference->mObjectID);
                ObjectIDType targetObjectID;
                if(itObjects == mSourceToTarget.end())
                {
                    targetObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
                    mSourceToTarget.insert(ObjectIDTypeToObjectIDTypeMap::value_type(indirectReference->mObjectID,targetObjectID));
                    ioObjectsToLaterCopy.push_back(indirectReference->mObjectID);
                }
                else
                {
                    targetObjectID = itObjects->second;
                }
                ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            inCommand->RegisterInDirectResourceInFormResources(targetObjectID)));
            }
            else 
            {
                
                ResourceCopierTask* task = new ResourceCopierTask(inTargetFormXObject,this,it.GetValue());
                StringToStringMap::iterator itInsert = ioMappedResourcesNames.insert(StringToStringMap::value_type(AsEncodedName(it.GetKey()->GetValue()),
                                                                            mDocumentContext->AddExtendedResourceMapping(inTargetFormXObject, inCommand->GetResourcesCategoryName(),
                                                                                task))).first;
                task->SetResourceName(itInsert->second);
            }
        }
    }
}